

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

WithFunctionSampleSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::WithFunctionSampleSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::FunctionPortListSyntax*&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,
          FunctionPortListSyntax **args_3)

{
  FunctionPortListSyntax *pFVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  WithFunctionSampleSyntax *pWVar17;
  
  pWVar17 = (WithFunctionSampleSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((WithFunctionSampleSyntax *)this->endPtr < pWVar17 + 1) {
    pWVar17 = (WithFunctionSampleSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pWVar17 + 1);
  }
  TVar5 = args->kind;
  uVar6 = args->field_0x2;
  NVar7.raw = (args->numFlags).raw;
  uVar8 = args->rawLen;
  pIVar2 = args->info;
  TVar9 = args_1->kind;
  uVar10 = args_1->field_0x2;
  NVar11.raw = (args_1->numFlags).raw;
  uVar12 = args_1->rawLen;
  pIVar3 = args_1->info;
  TVar13 = args_2->kind;
  uVar14 = args_2->field_0x2;
  NVar15.raw = (args_2->numFlags).raw;
  uVar16 = args_2->rawLen;
  pIVar4 = args_2->info;
  pFVar1 = *args_3;
  (pWVar17->super_SyntaxNode).kind = WithFunctionSample;
  (pWVar17->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pWVar17->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pWVar17->with).kind = TVar5;
  (pWVar17->with).field_0x2 = uVar6;
  (pWVar17->with).numFlags = (NumericTokenFlags)NVar7.raw;
  (pWVar17->with).rawLen = uVar8;
  (pWVar17->with).info = pIVar2;
  (pWVar17->function).kind = TVar9;
  (pWVar17->function).field_0x2 = uVar10;
  (pWVar17->function).numFlags = (NumericTokenFlags)NVar11.raw;
  (pWVar17->function).rawLen = uVar12;
  (pWVar17->function).info = pIVar3;
  (pWVar17->sample).kind = TVar13;
  (pWVar17->sample).field_0x2 = uVar14;
  (pWVar17->sample).numFlags = (NumericTokenFlags)NVar15.raw;
  (pWVar17->sample).rawLen = uVar16;
  (pWVar17->sample).info = pIVar4;
  pWVar17->portList = pFVar1;
  if (pFVar1 != (FunctionPortListSyntax *)0x0) {
    (pFVar1->super_SyntaxNode).parent = &pWVar17->super_SyntaxNode;
  }
  return pWVar17;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }